

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O0

void __thiscall cmXMLWriter::Attribute<float>(cmXMLWriter *this,char *name,float *value)

{
  ostream *poVar1;
  float fVar2;
  float *value_local;
  char *name_local;
  cmXMLWriter *this_local;
  
  PreAttribute(this);
  poVar1 = std::operator<<(this->Output,name);
  poVar1 = std::operator<<(poVar1,"=\"");
  fVar2 = SafeAttribute<float>(*value);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  std::operator<<(poVar1,'\"');
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }